

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

SAM_RG * sam_hdr_find_rg(SAM_hdr *hdr,char *rg)

{
  khint_t kVar1;
  uint uVar2;
  kh_m_s2i_t *pkVar3;
  khint32_t *pkVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  
  pkVar3 = hdr->rg_hash;
  kVar1 = pkVar3->n_buckets;
  if (kVar1 == 0) {
    uVar12 = 0;
LAB_00139d3e:
    if (uVar12 != kVar1) {
      return hdr->rg + pkVar3->vals[uVar12];
    }
  }
  else {
    uVar10 = (uint)*rg;
    if (*rg == '\0') {
      uVar10 = 0;
    }
    else {
      cVar5 = rg[1];
      if (cVar5 != '\0') {
        pcVar9 = rg + 2;
        do {
          uVar10 = (int)cVar5 + uVar10 * 0x1f;
          cVar5 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while (cVar5 != '\0');
      }
    }
    uVar10 = uVar10 & kVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar11 = 1;
    uVar12 = uVar10;
    do {
      uVar2 = pkVar4[uVar12 >> 4];
      bVar8 = (char)uVar12 * '\x02' & 0x1e;
      uVar6 = uVar2 >> bVar8;
      if (((uVar6 & 2) != 0) ||
         (((uVar6 & 1) == 0 && (iVar7 = strcmp(pkVar3->keys[uVar12],rg), iVar7 == 0)))) {
        if ((uVar2 >> bVar8 & 3) != 0) {
          uVar12 = kVar1;
        }
        goto LAB_00139d3e;
      }
      uVar12 = uVar12 + iVar11 & kVar1 - 1;
      iVar11 = iVar11 + 1;
    } while (uVar12 != uVar10);
  }
  return (SAM_RG *)0x0;
}

Assistant:

SAM_RG *sam_hdr_find_rg(SAM_hdr *hdr, const char *rg) {
    khint_t k = kh_get(m_s2i, hdr->rg_hash, rg);
    return k == kh_end(hdr->rg_hash)
	? NULL
	: &hdr->rg[kh_val(hdr->rg_hash, k)];
}